

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Split.hpp
# Opt level: O2

bool CLI::detail::split_short(string *current,string *name,string *rest)

{
  char *pcVar1;
  byte bVar2;
  bool bVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (1 < current->_M_string_length) {
    pcVar1 = (current->_M_dataplus)._M_p;
    if ((*pcVar1 == '-') &&
       ((bVar2 = pcVar1[1] - 10, 0x23 < bVar2 || ((0x800c00001U >> ((ulong)bVar2 & 0x3f) & 1) == 0))
       )) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_40,current,1,1);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (name,&local_40);
      ::std::__cxx11::string::~string((string *)&local_40);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_40,current,2,0xffffffffffffffff);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (rest,&local_40);
      ::std::__cxx11::string::~string((string *)&local_40);
      bVar3 = true;
    }
    else {
      bVar3 = false;
    }
    return bVar3;
  }
  return false;
}

Assistant:

inline bool split_short(const std::string &current, std::string &name, std::string &rest) {
    if(current.size() > 1 && current[0] == '-' && valid_first_char(current[1])) {
        name = current.substr(1, 1);
        rest = current.substr(2);
        return true;
    }
    return false;
}